

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void string_suite::test_space(void)

{
  string text;
  encoder_type encoder;
  ostringstream result;
  undefined4 local_1ec;
  long *local_1e8 [2];
  long local_1d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined **local_1a8;
  ostringstream *local_1a0;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8," ","");
  local_1a8 = &PTR__base_00118c10;
  local_1a0 = local_188;
  local_1e8[0] = (long *)trial::protocol::json::detail::basic_encoder<char,24ul>::
                         string_value<std::__cxx11::string>
                                   ((basic_encoder<char,24ul> *)&local_1a8,&local_1c8);
  local_1ec = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(text)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x23d,"void string_suite::test_space()",local_1e8,&local_1ec);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.str()","\"\\\" \\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x23e,"void string_suite::test_space()",local_1e8,"\" \"");
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  (*(code *)*local_1a8)();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void test_space()
{
    std::ostringstream result;
    std::string text(" ");
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(text), 3);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "\" \"");
}